

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O3

bool nv::ImageIO::save(char *fileName,Image *img)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  StdOutputStream stream;
  StdOutputStream local_38;
  
  StdOutputStream::StdOutputStream(&local_38,fileName);
  pFVar1 = local_38.super_StdStream.m_fp;
  if ((FILE *)local_38.super_StdStream.m_fp == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    iVar3 = ferror((FILE *)local_38.super_StdStream.m_fp);
    if (iVar3 == 0) {
      bVar2 = save(fileName,(Stream *)&local_38,img);
      if ((FILE *)local_38.super_StdStream.m_fp == (FILE *)0x0) {
        return bVar2;
      }
    }
    else {
      bVar2 = false;
      local_38.super_StdStream.m_fp = pFVar1;
    }
    local_38.super_StdStream.super_Stream._vptr_Stream = (_func_int **)&PTR__StdStream_0024e758;
    if (local_38.super_StdStream.m_autoclose == true) {
      fclose((FILE *)local_38.super_StdStream.m_fp);
    }
  }
  return bVar2;
}

Assistant:

bool nv::ImageIO::save(const char * fileName, Image * img)
{
	nvDebugCheck(fileName != NULL);
	nvDebugCheck(img != NULL);

	StdOutputStream stream(fileName);
	if (stream.isError())
	{
		return false;
	}

	return ImageIO::save(fileName, stream, img);
}